

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_GameCommand.cpp
# Opt level: O2

void __thiscall RenX::GameCommand::~GameCommand(GameCommand *this)

{
  Core *this_00;
  size_t sVar1;
  Server *this_01;
  size_t server_index;
  size_t index;
  const_iterator __position;
  string_view trigger;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR___cxa_pure_virtual_00165210;
  this_00 = getCore();
  __position._M_current =
       g_GameMasterCommandList.
       super__Vector_base<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  while( true ) {
    if (__position._M_current ==
        g_GameMasterCommandList.
        super__Vector_base<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001313f2;
    if (*__position._M_current == this) break;
    __position._M_current = __position._M_current + 1;
  }
  index = 0;
  while( true ) {
    sVar1 = Core::getServerCount(this_00);
    if (index == sVar1) break;
    this_01 = Core::getServer(this_00,index);
    if (this_01 != (Server *)0x0) {
      trigger = (string_view)Jupiter::Command::getTrigger((ulong)this);
      Server::removeCommand(this_01,trigger);
    }
    index = index + 1;
  }
  std::vector<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>::erase
            (&g_GameMasterCommandList,__position);
LAB_001313f2:
  Jupiter::Command::~Command(&this->super_Command);
  return;
}

Assistant:

RenX::GameCommand::~GameCommand() {
	RenX::Core *core = RenX::getCore();
	for (auto itr = RenX::GameMasterCommandList.begin(); itr != RenX::GameMasterCommandList.end(); ++itr) {
		if (*itr == this) {
			RenX::Server *server;
			for (size_t server_index = 0; server_index != core->getServerCount(); ++server_index) {
				server = core->getServer(server_index);
				if (server != nullptr) {
					server->removeCommand(this->getTrigger());
				}
			}

			RenX::GameMasterCommandList.erase(itr);
			break;
		}
	}
}